

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_kaku.c
# Opt level: O0

int kaku_send(rf_dev_t *dev,uint8_t *data)

{
  int iVar1;
  uint8_t *puVar2;
  undefined1 local_138 [8];
  timespec ifg_time;
  int i;
  uint8_t *frame_head;
  uint8_t frame_buf [234];
  int ret;
  uint8_t *data_local;
  rf_dev_t *dev_local;
  
  memset(&frame_head,0,0xea);
  frame_head._0_1_ = 0xff;
  puVar2 = encode_kaku(frame_buf + 1,*data);
  puVar2 = encode_kaku(puVar2,data[1]);
  puVar2 = encode_kaku(puVar2,data[2]);
  puVar2 = encode_kaku(puVar2,data[3]);
  *puVar2 = 0xff;
  ifg_time.tv_nsec._4_4_ = 0;
  while( true ) {
    if (3 < ifg_time.tv_nsec._4_4_) {
      return 0;
    }
    iVar1 = rf_send(dev,(uint8_t *)&frame_head,0xea);
    if (iVar1 != 0) break;
    local_138 = (undefined1  [8])0x0;
    ifg_time.tv_sec = 7700000;
    nanosleep((timespec *)local_138,(timespec *)0x0);
    ifg_time.tv_nsec._4_4_ = ifg_time.tv_nsec._4_4_ + 1;
  }
  return iVar1;
}

Assistant:

int kaku_send(rf_dev_t *dev, uint8_t data[4])
{
	int ret;
	uint8_t frame_buf[KAKU_FRAME_IVALS];
  	uint8_t *frame_head = frame_buf;

	memset(frame_buf, 0, sizeof(frame_buf));

	// Preamble
	*frame_head = 0xff;
	frame_head += KAKU_PREAMBLE_IVALS;

	// Data
	frame_head = encode_kaku(frame_head, data[0]);
	frame_head = encode_kaku(frame_head, data[1]);
	frame_head = encode_kaku(frame_head, data[2]);
	frame_head = encode_kaku(frame_head, data[3]);

	// Stop bit
	*frame_head = 0xff;

	for (int i=0; i < KAKU_FRAME_REPEAT; i++) {
		ret = rf_send(dev, frame_buf, sizeof(frame_buf));
		if (ret != ERR_OK) {
			return ret;
		}

		// Inter Frame Gap
		struct timespec ifg_time = {
			0, KAKU_INTER_FRAME_GAP_US * 1000
		};
		nanosleep(&ifg_time, NULL);
	}

	return ERR_OK;
}